

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.h
# Opt level: O0

void rapidjson::internal::TokenHelper<rapidjson::internal::Stack<rapidjson::CrtAllocator>,_char>::
     AppendIndexToken(Stack<rapidjson::CrtAllocator> *documentStack,SizeType index)

{
  char *pcVar1;
  char *pcVar2;
  char *end;
  char *buffer;
  SizeType index_local;
  Stack<rapidjson::CrtAllocator> *documentStack_local;
  
  pcVar1 = Stack<rapidjson::CrtAllocator>::Push<char>(documentStack,0xb);
  *pcVar1 = '/';
  pcVar2 = u32toa(index,pcVar1 + 1);
  Stack<rapidjson::CrtAllocator>::Pop<char>(documentStack,10 - ((long)pcVar2 - (long)(pcVar1 + 1)));
  return;
}

Assistant:

RAPIDJSON_FORCEINLINE static void AppendIndexToken(Stack& documentStack, SizeType index) {
        RAPIDJSON_IF_CONSTEXPR (sizeof(SizeType) == 4) {
            char *buffer = documentStack.template Push<char>(1 + 10); // '/' + uint
            *buffer++ = '/';
            const char* end = internal::u32toa(index, buffer);
             documentStack.template Pop<char>(static_cast<size_t>(10 - (end - buffer)));
        }
        else {
            char *buffer = documentStack.template Push<char>(1 + 20); // '/' + uint64
            *buffer++ = '/';
            const char* end = internal::u64toa(index, buffer);
            documentStack.template Pop<char>(static_cast<size_t>(20 - (end - buffer)));
        }